

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refine_peaks.cpp
# Opt level: O0

void trt_pose::parse::refine_peaks_out_nchw
               (float *refined_peaks,int *counts,int *peaks,float *cmap,int N,int C,int H,int W,
               int M,int window_size)

{
  int local_34;
  int n;
  int C_local;
  int N_local;
  float *cmap_local;
  int *peaks_local;
  int *counts_local;
  float *refined_peaks_local;
  
  for (local_34 = 0; local_34 < N; local_34 = local_34 + 1) {
    refine_peaks_out_chw
              (refined_peaks + local_34 * C * M * 2,counts + local_34 * C,
               peaks + local_34 * C * M * 2,cmap + local_34 * C * H * W,C,H,W,M,window_size);
  }
  return;
}

Assistant:

void refine_peaks_out_nchw(float *refined_peaks, // NxCxMx2
                           const int *counts,    // NxC
                           const int *peaks,     // NxCxMx2
                           const float *cmap, const int N, const int C,
                           const int H, const int W, const int M,
                           const int window_size) {
  for (int n = 0; n < N; n++) {
    refine_peaks_out_chw(&refined_peaks[n * C * M * 2], &counts[n * C],
                         &peaks[n * C * M * 2], &cmap[n * C * H * W], C, H, W,
                         M, window_size);
  }
}